

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>
::InnerMap::
iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
::SearchFrom(iterator_base<const_google::protobuf::MapPair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomModel_CustomModelParamValue>_>
             *this,size_type start_bucket)

{
  InnerMap *pIVar1;
  ulong uVar2;
  void **ppvVar3;
  Node *pNVar4;
  LogMessage *pLVar5;
  size_type sVar6;
  Tree *tree;
  LogFinisher local_59;
  LogMessage local_58;
  
  pIVar1 = this->m_;
  if ((pIVar1->index_of_first_non_null_ != pIVar1->num_buckets_) &&
     (pIVar1->table_[pIVar1->index_of_first_non_null_] == (void *)0x0)) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x218);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_58,
                        "CHECK failed: m_->index_of_first_non_null_ == m_->num_buckets_ || m_->table_[m_->index_of_first_non_null_] != nullptr: "
                       );
    internal::LogFinisher::operator=(&local_59,pLVar5);
    internal::LogMessage::~LogMessage(&local_58);
  }
  this->node_ = (Node *)0x0;
  uVar2 = this->m_->num_buckets_;
  sVar6 = start_bucket;
  if (start_bucket < uVar2) {
    ppvVar3 = this->m_->table_;
    do {
      pNVar4 = (Node *)ppvVar3[start_bucket];
      if (pNVar4 != (Node *)0x0) {
        if (pNVar4 != (Node *)ppvVar3[start_bucket ^ 1]) {
          this->bucket_index_ = start_bucket;
          this->node_ = pNVar4;
          return;
        }
        if ((pNVar4 != (Node *)0x0) && (pNVar4 == (Node *)ppvVar3[start_bucket ^ 1])) {
          this->bucket_index_ = start_bucket;
          if (*(long *)&pNVar4->field_0x30 == 0) {
            internal::LogMessage::LogMessage
                      (&local_58,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
                       ,0x221);
            pLVar5 = internal::LogMessage::operator<<(&local_58,"CHECK failed: !tree->empty(): ");
            internal::LogFinisher::operator=(&local_59,pLVar5);
            internal::LogMessage::~LogMessage(&local_58);
          }
          this->node_ = *(Node **)(*(long *)&pNVar4->field_0x20 + 0x28);
          return;
        }
      }
      start_bucket = start_bucket + 1;
      sVar6 = uVar2;
    } while (uVar2 != start_bucket);
  }
  this->bucket_index_ = sVar6;
  return;
}

Assistant:

void SearchFrom(size_type start_bucket) {
        GOOGLE_DCHECK(m_->index_of_first_non_null_ == m_->num_buckets_ ||
               m_->table_[m_->index_of_first_non_null_] != nullptr);
        node_ = nullptr;
        for (bucket_index_ = start_bucket; bucket_index_ < m_->num_buckets_;
             bucket_index_++) {
          if (m_->TableEntryIsNonEmptyList(bucket_index_)) {
            node_ = static_cast<Node*>(m_->table_[bucket_index_]);
            break;
          } else if (m_->TableEntryIsTree(bucket_index_)) {
            Tree* tree = static_cast<Tree*>(m_->table_[bucket_index_]);
            GOOGLE_DCHECK(!tree->empty());
            node_ = NodeFromTreeIterator(tree->begin());
            break;
          }
        }
      }